

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.h
# Opt level: O0

void __thiscall cnn::Trainer::status(Trainer *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[epoch=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0x14));
  poVar1 = std::operator<<(poVar1," eta=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0xc));
  poVar1 = std::operator<<(poVar1," clips=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0x24));
  poVar1 = std::operator<<(poVar1," updates=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0x28));
  std::operator<<(poVar1,"] ");
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

void status() {
    std::cerr << "[epoch=" << epoch << " eta=" << eta << " clips=" << clips << " updates=" << updates << "] ";
    updates = clips = 0;
  }